

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectTemplate(XFileParser *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_b1;
  string local_b0;
  int local_8c;
  undefined1 local_88 [8];
  string s;
  undefined1 local_60 [7];
  bool running;
  string guid;
  undefined1 local_30 [8];
  string name;
  XFileParser *this_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  readHeadOfDataObject(this,(string *)local_30);
  GetNextToken_abi_cxx11_((string *)local_60,this);
  s.field_2._M_local_buf[0xf] = '\x01';
  do {
    if ((s.field_2._M_local_buf[0xf] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_88,this);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"}");
    if (bVar1) {
      local_8c = 3;
    }
    else {
      lVar2 = std::__cxx11::string::length();
      if (lVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,
                   "Unexpected end of file reached while parsing template definition",&local_b1);
        ThrowException(this,&local_b0);
      }
      local_8c = 0;
    }
    std::__cxx11::string::~string((string *)local_88);
  } while (local_8c == 0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void XFileParser::ParseDataObjectTemplate()
{
    // parse a template data object. Currently not stored.
    std::string name;
    readHeadOfDataObject( &name);

    // read GUID
    std::string guid = GetNextToken();

    // read and ignore data members
    bool running = true;
    while ( running )
    {
        std::string s = GetNextToken();

        if( s == "}")
            break;

        if( s.length() == 0)
            ThrowException( "Unexpected end of file reached while parsing template definition");
    }
}